

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<long_double> * __thiscall Fad<long_double>::operator*=(Fad<long_double> *this,longdouble *val)

{
  uint uVar1;
  longdouble *plVar2;
  long lVar3;
  
  this->val_ = this->val_ * *val;
  uVar1 = (this->dx_).num_elts;
  if (((ulong)uVar1 != 0) && (0 < (int)uVar1)) {
    plVar2 = (this->dx_).ptr_to_data;
    lVar3 = 0;
    do {
      *(longdouble *)((long)plVar2 + lVar3) = *(longdouble *)((long)plVar2 + lVar3) * *val;
      lVar3 = lVar3 + 0x10;
    } while ((ulong)uVar1 << 4 != lVar3);
  }
  return this;
}

Assistant:

inline  Fad<T> & Fad<T>::operator*= (const T& val)
{
  val_ *= val;

  int sz = dx_.size();
  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    for (int i=0; i<sz;++i)
      dxp[i] *= val;
  }

  return *this;
}